

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O2

DdNode * Llb_ImgComputeCube(Aig_Man_t *pAig,Vec_Int_t *vNodeIds,DdManager *dd)

{
  abctime aVar1;
  int i;
  DdNode *n;
  void *pvVar2;
  DdNode *pDVar3;
  int i_00;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  n = Cudd_ReadOne(dd);
  Cudd_Ref(n);
  for (i_00 = 0; i_00 < vNodeIds->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vNodeIds,i_00);
    pvVar2 = Vec_PtrEntry(pAig->vObjs,i);
    pDVar3 = Cudd_bddIthVar(dd,*(int *)((long)pvVar2 + 0x24));
    pDVar3 = Cudd_bddAnd(dd,n,pDVar3);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,n);
    n = pDVar3;
  }
  Cudd_Deref(n);
  dd->TimeStop = aVar1;
  return n;
}

Assistant:

DdNode * Llb_ImgComputeCube( Aig_Man_t * pAig, Vec_Int_t * vNodeIds, DdManager * dd )
{
    DdNode * bProd, * bTemp;
    Aig_Obj_t * pObj;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bProd = Cudd_ReadOne(dd);   Cudd_Ref( bProd );
    Aig_ManForEachObjVec( vNodeIds, pAig, pObj, i )
    {
        bProd  = Cudd_bddAnd( dd, bTemp = bProd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)) ); Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bProd );
    dd->TimeStop = TimeStop;
    return bProd;
}